

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_233176::GetLoadStoreInfo
                    (VmModule *module,VmValue *loadPointer,VmConstant *loadOffset,uint loadSize,
                    uint accessSize,VmInstructionType loadCmd)

{
  uint uVar1;
  uint storeOffset;
  uint loadOffset_00;
  LoadStoreInfo *pLVar2;
  VmConstant *pVVar3;
  long lVar4;
  long lVar5;
  TypeBase *pTVar6;
  bool bVar7;
  bool bVar8;
  VmInstruction *pVVar9;
  ulong uVar10;
  int value;
  long lVar11;
  ulong uVar12;
  Allocator *pAVar13;
  VmConstant **ppVVar14;
  VmConstant *rhs;
  VmInstruction *unaff_R14;
  VmValue *value_00;
  bool bVar15;
  double value_01;
  
  if ((loadPointer == (VmValue *)0x0) || (rhs = (VmConstant *)loadPointer, loadPointer->typeID != 1)
     ) {
    rhs = (VmConstant *)0x0;
  }
  if (rhs == (VmConstant *)0x0) {
    uVar12 = (ulong)(module->loadStoreInfo).count;
    bVar15 = uVar12 != 0;
    if (bVar15) {
      ppVVar14 = &((module->loadStoreInfo).data)->loadOffset;
      uVar10 = 1;
      do {
        pVVar9 = ((LoadStoreInfo *)(ppVVar14 + -6))->loadInst;
        bVar7 = true;
        if ((((pVVar9 != (VmInstruction *)0x0) &&
             (&ppVVar14[-1]->super_VmValue == loadPointer &&
              &ppVVar14[-1]->super_VmValue != (VmValue *)0x0)) &&
            ((*ppVVar14)->iValue == loadOffset->iValue)) && (*(uint *)(ppVVar14 + -3) == accessSize)
           ) {
          if (pVVar9->parent == (VmBlock *)0x0) {
            __assert_fail("el.loadInst->parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x6c7,
                          "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                         );
          }
          bVar7 = false;
          unaff_R14 = pVVar9;
        }
        if (!bVar7) break;
        bVar15 = uVar10 < uVar12;
        ppVVar14 = ppVVar14 + 0xb;
        bVar7 = uVar10 != uVar12;
        uVar10 = uVar10 + 1;
      } while (bVar7);
    }
    if (bVar15) {
      return &unaff_R14->super_VmValue;
    }
  }
  else if (rhs->container != (VariableData *)0x0) {
    if (loadOffset->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x692,
                    "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                   );
    }
    bVar15 = (module->loadStoreInfo).count != 0;
    if (bVar15) {
      lVar11 = 0;
      uVar12 = 0;
      do {
        pLVar2 = (module->loadStoreInfo).data;
        if (((*(long *)((long)&pLVar2->loadInst + lVar11) != 0) &&
            (pVVar3 = *(VmConstant **)((long)&pLVar2->loadAddress + lVar11),
            pVVar3 != (VmConstant *)0x0)) &&
           ((bVar7 = VmConstant::operator==(pVVar3,rhs), bVar7 &&
            (*(uint *)((long)&pLVar2->accessSize + lVar11) == accessSize)))) {
          unaff_R14 = *(VmInstruction **)((long)&pLVar2->loadInst + lVar11);
          if (unaff_R14->parent == (VmBlock *)0x0) {
            __assert_fail("el.loadInst->parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x69d,
                          "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                         );
          }
          bVar7 = false;
          goto LAB_0028c5cb;
        }
        bVar7 = true;
        if ((*(long *)((long)&pLVar2->storeInst + lVar11) == 0) ||
           (pVVar3 = *(VmConstant **)((long)&pLVar2->storeAddress + lVar11),
           pVVar3 == (VmConstant *)0x0)) goto LAB_0028c5cb;
        bVar8 = VmConstant::operator==(pVVar3,rhs);
        uVar1 = *(uint *)((long)&pLVar2->accessSize + lVar11);
        if ((bVar8) && (uVar1 == accessSize)) {
          lVar4 = *(long *)((long)&pLVar2->storeInst + lVar11);
          if (*(uint *)(lVar4 + 0xa8) < 3) {
LAB_0028c6b0:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                         );
          }
          pVVar9 = *(VmInstruction **)(*(long *)(lVar4 + 0xa0) + 0x10);
          if ((pVVar9->super_VmValue).type.size != loadSize) {
            pVVar9 = (VmInstruction *)0x0;
          }
LAB_0028c4bd:
          bVar7 = false;
          unaff_R14 = pVVar9;
          goto LAB_0028c5cb;
        }
        lVar4 = *(long *)((long)&pLVar2->storeAddress + lVar11);
        if ((*(VariableData **)(lVar4 + 200) != rhs->container) || (uVar1 < accessSize))
        goto LAB_0028c5cb;
        lVar5 = *(long *)((long)&pLVar2->storeInst + lVar11);
        if (*(uint *)(lVar5 + 0xa8) < 3) goto LAB_0028c6b0;
        value_00 = *(VmValue **)(*(long *)(lVar5 + 0xa0) + 0x10);
        storeOffset = *(uint *)(lVar4 + 0x98);
        loadOffset_00 = rhs->iValue;
        pVVar9 = (VmInstruction *)
                 TryExtractConstructElement(value_00,storeOffset,loadOffset_00,accessSize);
        if (pVVar9 != (VmInstruction *)0x0) goto LAB_0028c4bd;
        if ((value_00 == (VmValue *)0x0) || (value_00->typeID != 1)) {
          value_00 = (VmValue *)0x0;
        }
        uVar10 = (ulong)(loadOffset_00 - storeOffset);
        if (loadOffset_00 < storeOffset) {
LAB_0028c50b:
          pVVar9 = (VmInstruction *)0x0;
          goto switchD_0028c541_caseD_1;
        }
        pVVar9 = (VmInstruction *)0x0;
        if (value_00 == (VmValue *)0x0) goto switchD_0028c541_caseD_1;
        if (storeOffset + uVar1 < loadOffset_00 + accessSize) goto LAB_0028c50b;
        pTVar6 = value_00[1].type.structType;
        if (pTVar6 == (TypeBase *)0x0) {
          __assert_fail("constant->sValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x663,
                        "VmValue *(anonymous namespace)::TryExtractConstant(VmModule *, VmValue *, unsigned int, unsigned int, unsigned int, unsigned int, VmInstructionType)"
                       );
        }
        pVVar9 = (VmInstruction *)0x0;
        switch(loadCmd) {
        case VM_INST_LOAD_BYTE:
          pAVar13 = module->allocator;
          value = (int)*(char *)((long)&pTVar6->_vptr_TypeBase + uVar10);
          goto LAB_0028c577;
        case VM_INST_LOAD_INT:
          value = *(int *)((long)&pTVar6->_vptr_TypeBase + uVar10);
          pAVar13 = module->allocator;
LAB_0028c577:
          pVVar9 = (VmInstruction *)CreateConstantInt(pAVar13,(SynBase *)0x0,value);
          break;
        case VM_INST_LOAD_FLOAT:
          pAVar13 = module->allocator;
          value_01 = (double)*(float *)((long)&pTVar6->_vptr_TypeBase + uVar10);
          goto LAB_0028c591;
        case VM_INST_LOAD_DOUBLE:
          value_01 = *(double *)((long)&pTVar6->_vptr_TypeBase + uVar10);
          pAVar13 = module->allocator;
LAB_0028c591:
          pVVar9 = (VmInstruction *)CreateConstantDouble(pAVar13,(SynBase *)0x0,value_01);
          break;
        case VM_INST_LOAD_LONG:
          pVVar9 = (VmInstruction *)
                   CreateConstantLong(module->allocator,(SynBase *)0x0,
                                      *(longlong *)((long)&pTVar6->_vptr_TypeBase + uVar10));
        }
switchD_0028c541_caseD_1:
        bVar7 = pVVar9 == (VmInstruction *)0x0;
        if (!bVar7) {
          unaff_R14 = pVVar9;
        }
LAB_0028c5cb:
        if (!bVar7) break;
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x58;
        bVar15 = uVar12 < (module->loadStoreInfo).count;
      } while (bVar15);
    }
    if (bVar15) {
      return &unaff_R14->super_VmValue;
    }
  }
  return (VmValue *)0x0;
}

Assistant:

VmValue* GetLoadStoreInfo(VmModule *module, VmValue *loadPointer, VmConstant *loadOffset, unsigned loadSize, unsigned accessSize, VmInstructionType loadCmd)
	{
		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return NULL;

			assert(loadOffset->iValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadAddress)
				{
					if(*el.loadAddress == *loadAddress && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}

				// Reuse store argument
				if(el.storeInst && el.storeAddress)
				{
					if(*el.storeAddress == *loadAddress && accessSize == el.accessSize)
					{
						VmValue *value = el.storeInst->arguments[2];

						// Can't reuse arguments of a different size
						if(value->type.size != loadSize)
							return NULL;

						return value;
					}

					if(el.storeAddress->container == loadAddress->container && accessSize <= el.accessSize)
					{
						if(VmValue *component = TryExtractConstructElement(el.storeInst->arguments[2], el.storeAddress->iValue, loadAddress->iValue, accessSize))
							return component;

						if(VmValue *constant = TryExtractConstant(module, el.storeInst->arguments[2], el.storeAddress->iValue, el.accessSize, loadAddress->iValue, accessSize, loadCmd))
							return constant;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadPointer)
				{
					if(el.loadPointer == loadPointer && el.loadOffset->iValue == loadOffset->iValue && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}
			}
		}

		return NULL;
	}